

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

size_t EntityRelationTask::predict_entity
                 (search *sch,example *ex,v_array<unsigned_long> *param_3,ptag my_tag,bool isLdf)

{
  void *pvVar1;
  long lVar2;
  action aVar3;
  predictor *ppVar4;
  long lVar5;
  int iVar6;
  uint64_t plus_amount;
  float loss;
  long lStack_150;
  v_array<unsigned_int> star_labels;
  predictor local_118;
  
  pvVar1 = sch->task_data;
  if (*(char *)((long)pvVar1 + 0x11) == '\x01') {
    star_labels.end_array = (uint *)0x0;
    star_labels.erase_count = 0;
    star_labels._begin = (uint *)0x0;
    star_labels._end = (uint *)0x0;
    v_array<unsigned_int>::push_back(&star_labels,(uint *)&(ex->l).empty);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back(&star_labels,(uint *)&local_118);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)((long)pvVar1 + 0x18),(uint *)&local_118);
    Search::predictor::predictor(&local_118,sch,my_tag);
    ppVar4 = Search::predictor::set_input(&local_118,ex);
    ppVar4 = Search::predictor::set_oracle(ppVar4,&star_labels);
    ppVar4 = Search::predictor::set_allowed(ppVar4,(v_array<unsigned_int> *)((long)pvVar1 + 0x18));
    ppVar4 = Search::predictor::set_learner_id(ppVar4,1);
    aVar3 = Search::predictor::predict(ppVar4);
    Search::predictor::~predictor(&local_118);
    *(long *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) + -4;
  }
  else {
    if (isLdf) {
      iVar6 = 0;
      lVar5 = 0;
      for (plus_amount = 0x49be95; plus_amount != 0x170b8e9; plus_amount = plus_amount + 0x49be95) {
        VW::copy_example_data(false,(example *)(*(long *)((long)pvVar1 + 0x60) + lVar5),ex);
        update_example_indicies
                  (false,(example *)(*(long *)((long)pvVar1 + 0x60) + lVar5),0x1b90d09,plus_amount);
        lVar2 = *(long *)((long)pvVar1 + 0x60);
        **(undefined4 **)(lVar2 + 0x6828 + lVar5) = 0;
        *(int *)(*(long *)(lVar2 + 0x6828 + lVar5) + 4) = iVar6;
        *(undefined4 *)(*(long *)(lVar2 + 0x6828 + lVar5) + 8) = 0;
        *(undefined4 *)(*(long *)(lVar2 + 0x6828 + lVar5) + 0xc) = 0;
        lVar5 = lVar5 + 0x68d0;
        iVar6 = iVar6 + 1;
      }
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar4 = Search::predictor::set_input(&local_118,*(example **)((long)pvVar1 + 0x60),4);
      ppVar4 = Search::predictor::set_oracle(ppVar4,(ex->l).multi.label - 1);
      ppVar4 = Search::predictor::set_learner_id(ppVar4,1);
      aVar3 = Search::predictor::predict(ppVar4);
      aVar3 = aVar3 + 1;
    }
    else {
      Search::predictor::predictor(&local_118,sch,my_tag);
      ppVar4 = Search::predictor::set_input(&local_118,ex);
      ppVar4 = Search::predictor::set_oracle(ppVar4,(ex->l).multi.label);
      ppVar4 = Search::predictor::set_allowed(ppVar4,(v_array<unsigned_int> *)((long)pvVar1 + 0x18))
      ;
      ppVar4 = Search::predictor::set_learner_id(ppVar4,0);
      aVar3 = Search::predictor::predict(ppVar4);
    }
    Search::predictor::~predictor(&local_118);
  }
  if (aVar3 == 0xb) {
    lStack_150 = 0xc;
  }
  else {
    loss = 0.0;
    if (aVar3 == (ex->l).multi.label) goto LAB_00227fbc;
    lStack_150 = 4;
  }
  loss = *(float *)((long)pvVar1 + lStack_150);
LAB_00227fbc:
  Search::search::loss(sch,loss);
  return (ulong)aVar3;
}

Assistant:

size_t predict_entity(
    Search::search& sch, example* ex, v_array<size_t>& /*predictions*/, ptag my_tag, bool isLdf = false)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t prediction;
  if (my_task_data->allow_skip)
  {
    v_array<uint32_t> star_labels = v_init<uint32_t>();
    star_labels.push_back(ex->l.multi.label);
    star_labels.push_back(LABEL_SKIP);
    my_task_data->y_allowed_entity.push_back(LABEL_SKIP);
    prediction = Search::predictor(sch, my_tag)
                     .set_input(*ex)
                     .set_oracle(star_labels)
                     .set_allowed(my_task_data->y_allowed_entity)
                     .set_learner_id(1)
                     .predict();
    my_task_data->y_allowed_entity.pop();
  }
  else
  {
    if (isLdf)
    {
      for (uint32_t a = 0; a < 4; a++)
      {
        VW::copy_example_data(false, &my_task_data->ldf_entity[a], ex);
        update_example_indicies(true, &my_task_data->ldf_entity[a], 28904713, 4832917 * (uint64_t)(a + 1));
        CS::label& lab = my_task_data->ldf_entity[a].l.cs;
        lab.costs[0].x = 0.f;
        lab.costs[0].class_index = a;
        lab.costs[0].partial_prediction = 0.f;
        lab.costs[0].wap_value = 0.f;
      }
      prediction = Search::predictor(sch, my_tag)
                       .set_input(my_task_data->ldf_entity, 4)
                       .set_oracle(ex->l.multi.label - 1)
                       .set_learner_id(1)
                       .predict() +
          1;
    }
    else
    {
      prediction = Search::predictor(sch, my_tag)
                       .set_input(*ex)
                       .set_oracle(ex->l.multi.label)
                       .set_allowed(my_task_data->y_allowed_entity)
                       .set_learner_id(0)
                       .predict();
    }
  }

  // record loss
  float loss = 0.0;
  if (prediction == LABEL_SKIP)
  {
    loss = my_task_data->skip_cost;
  }
  else if (prediction != ex->l.multi.label)
    loss = my_task_data->entity_cost;
  sch.loss(loss);
  return prediction;
}